

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_argsof_lambda_auto.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  tst_cpp14_argsof_lambda_auto tc;
  QCoreApplication app;
  int local_2c;
  undefined **local_28 [2];
  QCoreApplication local_18 [16];
  
  local_2c = argc;
  QCoreApplication::QCoreApplication(local_18,&local_2c,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  QObject::QObject((QObject *)local_28,(QObject *)0x0);
  local_28[0] = &PTR_metaObject_00104d18;
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/cpp14/tst_argsof_lambda_auto.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O3/tests/auto/qtpromise/cpp14"
            );
  iVar1 = QTest::qExec((QObject *)local_28,local_2c,argv);
  QObject::~QObject((QObject *)local_28);
  QCoreApplication::~QCoreApplication(local_18);
  return iVar1;
}

Assistant:

void tst_cpp14_argsof_lambda_auto::lambdaAutoArgs()
{
    auto lOneArg = [](auto) {};
    auto lManyArgs = [](const auto&, auto, auto) {};
    auto lMutable = [](const auto&, auto) mutable {};

    Q_STATIC_ASSERT((ArgsOf<decltype(lOneArg)>::count == 0));
    Q_STATIC_ASSERT((ArgsOf<decltype(lManyArgs)>::count == 0));
    Q_STATIC_ASSERT((ArgsOf<decltype(lMutable)>::count == 0));
}